

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

TldAddressAsKey * __thiscall
BinHash<TldAddressAsKey>::Retrieve(BinHash<TldAddressAsKey> *this,TldAddressAsKey *key)

{
  bool bVar1;
  uint32_t uVar2;
  byte local_31;
  TldAddressAsKey *pTStack_20;
  uint32_t hash_index;
  TldAddressAsKey *ret;
  TldAddressAsKey *key_local;
  BinHash<TldAddressAsKey> *this_local;
  
  pTStack_20 = (TldAddressAsKey *)0x0;
  if ((key != (TldAddressAsKey *)0x0) && (this->tableSize != 0)) {
    uVar2 = TldAddressAsKey::Hash(key);
    pTStack_20 = this->hashBin[uVar2 % this->tableSize];
    while( true ) {
      local_31 = 0;
      if (pTStack_20 != (TldAddressAsKey *)0x0) {
        bVar1 = TldAddressAsKey::IsSameKey(key,pTStack_20);
        local_31 = bVar1 ^ 0xff;
      }
      if ((local_31 & 1) == 0) break;
      pTStack_20 = pTStack_20->HashNext;
    }
  }
  return pTStack_20;
}

Assistant:

KeyObj * Retrieve(KeyObj * key)
    {
        KeyObj * ret = 0;

        if (key != 0 && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;

            ret = hashBin[hash_index];

            while (ret != NULL && !key->IsSameKey(ret))
            {
                ret = ret->HashNext;
            }
        }

        return ret;
    }